

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::Zero(Bignum *this)

{
  uint *puVar1;
  long lVar2;
  
  if (0 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar2 = 0;
    do {
      if ((this->bigits_).length_ <= lVar2) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      puVar1[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Zero() {
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = 0;
  exponent_ = 0;
}